

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

void duckdb::DecimalToString::FormatDecimal<int>
               (int value,uint8_t width,uint8_t scale,char *dst,idx_t len)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  char *__s;
  char *ptr;
  
  if (value < 0) {
    value = -value;
    *dst = '-';
  }
  ptr = dst + len;
  if (scale != '\0') {
    uVar2 = (ulong)scale;
    uVar1 = *(uint *)(NumericHelper::POWERS_OF_TEN + uVar2 * 8);
    pcVar3 = NumericHelper::FormatUnsigned<unsigned_int>((uint)value % uVar1,ptr);
    __s = ptr + -uVar2;
    if (__s < pcVar3) {
      switchD_01306cb1::default(__s,0x30,(size_t)(pcVar3 + (uVar2 - (long)ptr)));
      pcVar3 = __s;
    }
    pcVar3[-1] = '.';
    if (width <= scale) {
      return;
    }
    ptr = pcVar3 + -1;
    value = (uint)value / uVar1;
  }
  NumericHelper::FormatUnsigned<unsigned_int>(value,ptr);
  return;
}

Assistant:

static void FormatDecimal(SIGNED value, uint8_t width, uint8_t scale, char *dst, idx_t len) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		char *end = dst + len;
		if (value < 0) {
			value = -value;
			*dst = '-';
		}
		if (scale == 0) {
			NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(value), end);
			return;
		}
		// we write two numbers:
		// the numbers BEFORE the decimal (major)
		// and the numbers AFTER the decimal (minor)
		auto minor =
		    UnsafeNumericCast<UNSIGNED>(value) % UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		auto major =
		    UnsafeNumericCast<UNSIGNED>(value) / UnsafeNumericCast<UNSIGNED>(NumericHelper::POWERS_OF_TEN[scale]);
		// write the number after the decimal
		dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(minor), end);
		// (optionally) pad with zeros and add the decimal point
		while (dst > (end - scale)) {
			*--dst = '0';
		}
		*--dst = '.';
		// now write the part before the decimal
		D_ASSERT(width > scale || major == 0);
		if (width > scale) {
			// there are numbers after the comma
			dst = NumericHelper::FormatUnsigned<UNSIGNED>(UnsafeNumericCast<UNSIGNED>(major), dst);
		}
	}